

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_weighted<float,unsigned_long,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double *x_sd,double *x_mean,
               vector<double,_std::allocator<double>_> *w)

{
  ulong *puVar1;
  double __x;
  unsigned_long uVar2;
  pointer pdVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  unsigned_long uVar13;
  double __z;
  double __z_00;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar13 = Xc_indptr[col_num];
  uVar2 = Xc_indptr[col_num + 1];
  if (uVar13 == uVar2) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar7 = ix_arr + st;
  puVar11 = ix_arr + end + 1;
  uVar5 = (long)puVar11 - (long)puVar7 >> 3;
  if (0 < (long)uVar5) {
    do {
      uVar10 = uVar5 >> 1;
      uVar6 = ~uVar10 + uVar5;
      uVar5 = uVar10;
      if ((puVar7 + uVar10 + 1)[-1] < Xc_ind[uVar13]) {
        puVar7 = puVar7 + uVar10 + 1;
        uVar5 = uVar6;
      }
    } while (0 < (long)uVar5);
  }
  dVar14 = 0.0;
  if (st <= end) {
    do {
      dVar14 = dVar14 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[ix_arr[st]];
      st = st + 1;
    } while (st <= end);
  }
  if (puVar7 != puVar11) {
    uVar5 = Xc_ind[uVar2 - 1];
    pdVar3 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __z_00 = 0.0;
    __z = 0.0;
    dVar15 = 0.0;
    while (uVar6 = *puVar7, uVar6 <= uVar5) {
      puVar1 = Xc_ind + uVar13;
      uVar10 = *puVar1;
      if (uVar10 == uVar6) {
        __x = pdVar3[uVar6];
        if ((uint)ABS(Xc[uVar13]) < 0x7f800000) {
          dVar16 = (double)Xc[uVar13];
          bVar4 = dVar15 == 0.0;
          uVar6 = ~-(ulong)bVar4 & (ulong)__z_00;
          dVar15 = dVar15 + __x;
          __z_00 = fma(__x,(dVar16 - __z_00) / dVar15,__z_00);
          __z = fma(__x,(dVar16 - (double)(uVar6 | -(ulong)bVar4 & (ulong)dVar16)) *
                        (dVar16 - __z_00),__z);
        }
        else {
          dVar14 = dVar14 - __x;
        }
        if ((puVar7 == ix_arr + end) || (uVar13 == uVar2 - 1)) break;
        puVar12 = puVar1 + 1;
        puVar7 = puVar7 + 1;
        uVar6 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar12)) >> 3;
        if (0 < (long)uVar6) {
          do {
            uVar10 = uVar6 >> 1;
            uVar8 = ~uVar10 + uVar6;
            uVar6 = uVar10;
            if (puVar12[uVar10] < *puVar7) {
              puVar12 = puVar12 + uVar10 + 1;
              uVar6 = uVar8;
            }
          } while (0 < (long)uVar6);
        }
LAB_002f3a74:
        uVar13 = (long)puVar12 - (long)Xc_ind >> 3;
      }
      else {
        if (uVar10 <= uVar6) {
          puVar12 = puVar1 + 1;
          uVar10 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar1 + 1))) >> 3;
          while (0 < (long)uVar10) {
            uVar8 = uVar10 >> 1;
            uVar9 = ~uVar8 + uVar10;
            uVar10 = uVar8;
            if (puVar12[uVar8] < uVar6) {
              puVar12 = puVar12 + uVar8 + 1;
              uVar10 = uVar9;
            }
          }
          goto LAB_002f3a74;
        }
        puVar7 = puVar7 + 1;
        uVar6 = (long)puVar11 - (long)puVar7 >> 3;
        while (0 < (long)uVar6) {
          uVar8 = uVar6 >> 1;
          uVar9 = ~uVar8 + uVar6;
          uVar6 = uVar8;
          if ((puVar7 + uVar8 + 1)[-1] < uVar10) {
            puVar7 = puVar7 + uVar8 + 1;
            uVar6 = uVar9;
          }
        }
      }
      if ((puVar7 == puVar11) || (uVar13 == uVar2)) break;
    }
    if ((dVar15 != 0.0) || (NAN(dVar15))) {
      if (dVar15 < dVar14) {
        __z = __z + (1.0 - dVar15 / dVar14) * dVar15 * __z_00 * __z_00;
        __z_00 = __z_00 * (dVar15 / dVar14);
      }
      *x_mean = __z_00;
      dVar14 = SQRT(__z / dVar14);
      goto LAB_002f3b10;
    }
  }
  *x_mean = 0.0;
  dVar14 = 0.0;
LAB_002f3b10:
  *x_sd = dVar14;
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}